

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestApp.cpp
# Opt level: O2

void HomePage(Page *page)

{
  tm *__tp;
  ostream *poVar1;
  ostream *poVar2;
  char *pcVar3;
  time_t t;
  
  t = time((time_t *)0x0);
  __tp = localtime(&t);
  poVar1 = http::Page::get_output_stream(page);
  poVar2 = std::operator<<(poVar1,"<span>Current time: ");
  pcVar3 = asctime(__tp);
  poVar2 = std::operator<<(poVar2,pcVar3);
  std::operator<<(poVar2,"</span>\n");
  std::operator<<(poVar1,"<table class=\"table table-striped\">\n");
  std::operator<<(poVar1,"  <thead>\n");
  std::operator<<(poVar1,"    <th>Protocol</th>\n");
  std::operator<<(poVar1,"    <th>Size of class</th>\n");
  std::operator<<(poVar1,"  </thead>\n");
  std::operator<<(poVar1,"  <tbody>\n");
  poVar2 = std::operator<<(poVar1,"    <tr><td>MAC</td><td>");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::operator<<(poVar2,"</td></tr>\n");
  poVar2 = std::operator<<(poVar1,"     <tr><td>IP</td><td>");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::operator<<(poVar2,"</td></tr>\n");
  poVar2 = std::operator<<(poVar1,"    <tr><td>TCP</td><td>");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::operator<<(poVar2,"</td></tr>\n");
  poVar2 = std::operator<<(poVar1,"    <tr><td>ARP</td><td>");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::operator<<(poVar2,"</td></tr>\n");
  poVar2 = std::operator<<(poVar1,"   <tr><td>ICMP</td><td>");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::operator<<(poVar2,"</td></tr>\n");
  poVar2 = std::operator<<(poVar1,"   <tr><td>DHCP</td><td>");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::operator<<(poVar2,"</td></tr>\n");
  std::operator<<(poVar1,"  </tbody>\n");
  std::operator<<(poVar1,"</table>\n");
  return;
}

Assistant:

void HomePage(http::Page* page)
{
    time_t t = time(nullptr);
    struct tm* now = localtime(&t);
    std::ostream& out = page->get_output_stream();

    out << "<span>Current time: " << asctime(now) << "</span>\n";

    out << "<table class=\"table table-striped\">\n";
    out << "  <thead>\n";
    out << "    <th>Protocol</th>\n";
    out << "    <th>Size of class</th>\n";
    out << "  </thead>\n";
    out << "  <tbody>\n";
    out << "    <tr><td>MAC</td><td>" << sizeof(tcpStack.MAC) << "</td></tr>\n";
    out << "     <tr><td>IP</td><td>" << sizeof(tcpStack.IP) << "</td></tr>\n";
    out << "    <tr><td>TCP</td><td>" << sizeof(tcpStack.TCP) << "</td></tr>\n";
    out << "    <tr><td>ARP</td><td>" << sizeof(tcpStack.ARP) << "</td></tr>\n";
    out << "   <tr><td>ICMP</td><td>" << sizeof(tcpStack.ICMP) << "</td></tr>\n";
    out << "   <tr><td>DHCP</td><td>" << sizeof(tcpStack.DHCP) << "</td></tr>\n";
    out << "  </tbody>\n";
    out << "</table>\n";
}